

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cpp
# Opt level: O1

int __thiscall ncnn::Interp::forward(Interp *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float *pfVar1;
  size_t __size;
  undefined4 uVar2;
  undefined8 uVar3;
  uint uVar4;
  uint uVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  float fVar9;
  float fVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  int remain;
  ulong uVar14;
  float *pfVar15;
  int *piVar16;
  int *piVar17;
  long lVar18;
  int iVar19;
  long lVar20;
  float *pfVar21;
  int *piVar22;
  int iVar23;
  float *pfVar24;
  uint uVar25;
  ulong uVar26;
  long lVar27;
  Mat *pMVar28;
  ulong uVar29;
  float *pfVar30;
  int iVar31;
  float *pfVar32;
  float *rows1p_1;
  float *pfVar33;
  int iVar34;
  float *rows0p;
  ulong uVar35;
  float *pfVar36;
  float *rows1p_2;
  ulong uVar37;
  float *pfVar38;
  float *pfVar39;
  float *rows3p;
  void *pvVar40;
  uint w;
  float *rows2p;
  uint uVar41;
  size_t totalsize;
  size_t sVar42;
  int *piVar43;
  float fVar44;
  float fVar46;
  undefined1 auVar45 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  float *local_108;
  int *local_100;
  float *local_f8;
  float *local_f0;
  float *local_e8;
  float *local_e0;
  int *local_d8;
  float *local_d0;
  ulong local_c8;
  int *local_c0;
  float *local_b8;
  float *local_b0;
  float *local_a8;
  size_t local_a0;
  Mat *local_98;
  Mat *local_90;
  int *local_88;
  float *local_80;
  float *local_78;
  float *local_70;
  float *local_68;
  float *local_60;
  float *local_58;
  float *local_50;
  ulong local_48;
  float *local_40;
  ulong local_38;
  
  uVar4 = bottom_blob->w;
  uVar41 = this->output_width;
  uVar25 = this->output_height;
  if (bottom_blob->dims == 1) {
    w = 1;
    uVar5 = 1;
  }
  else {
    w = bottom_blob->h;
    uVar5 = uVar4;
    uVar4 = bottom_blob->c;
  }
  local_f8 = (float *)(ulong)uVar5;
  if (uVar41 == 0 || uVar25 == 0) {
    uVar25 = (uint)((float)(int)w * this->height_scale);
    uVar41 = (uint)((float)(int)uVar5 * this->width_scale);
  }
  uVar37 = (ulong)uVar41;
  uVar35 = (ulong)uVar25;
  local_90 = bottom_blob;
  if ((uVar25 == w) && (uVar41 == uVar5)) {
    if (top_blob != bottom_blob) {
      piVar43 = bottom_blob->refcount;
      if (piVar43 != (int *)0x0) {
        LOCK();
        *piVar43 = *piVar43 + 1;
        UNLOCK();
      }
      piVar43 = top_blob->refcount;
      if (piVar43 != (int *)0x0) {
        LOCK();
        *piVar43 = *piVar43 + -1;
        UNLOCK();
        if (*piVar43 == 0) {
          if (top_blob->allocator == (Allocator *)0x0) {
            if (top_blob->data != (void *)0x0) {
              free(top_blob->data);
              bottom_blob = local_90;
            }
          }
          else {
            (**(code **)(*(long *)top_blob->allocator + 0x18))();
            bottom_blob = local_90;
          }
        }
      }
      *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
      *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
      top_blob->data = (void *)0x0;
      top_blob->refcount = (int *)0x0;
      top_blob->dims = 0;
      top_blob->w = 0;
      top_blob->h = 0;
      top_blob->c = 0;
      top_blob->cstep = 0;
      piVar43 = bottom_blob->refcount;
      top_blob->data = bottom_blob->data;
      top_blob->refcount = piVar43;
      top_blob->elemsize = bottom_blob->elemsize;
      top_blob->elempack = bottom_blob->elempack;
      top_blob->allocator = bottom_blob->allocator;
      iVar19 = bottom_blob->w;
      iVar34 = bottom_blob->h;
      iVar31 = bottom_blob->c;
      top_blob->dims = bottom_blob->dims;
      top_blob->w = iVar19;
      top_blob->h = iVar34;
      top_blob->c = iVar31;
      top_blob->cstep = bottom_blob->cstep;
      return 0;
    }
    return 0;
  }
  local_e8 = (float *)CONCAT44(local_e8._4_4_,uVar4);
  Mat::create(top_blob,uVar41,uVar25,uVar4,bottom_blob->elemsize,opt->blob_allocator);
  auVar13 = _DAT_00177260;
  auVar12 = _DAT_00177250;
  auVar11 = _DAT_001770f0;
  if (top_blob->data == (void *)0x0) {
    return -100;
  }
  if ((long)top_blob->c * top_blob->cstep != 0) {
    if (local_90->dims == 1) {
      if (0 < (int)local_e8) {
        sVar42 = top_blob->cstep;
        uVar41 = top_blob->h * top_blob->w;
        pvVar40 = local_90->data;
        lVar20 = (ulong)uVar41 - 1;
        auVar45._8_4_ = (int)lVar20;
        auVar45._0_8_ = lVar20;
        auVar45._12_4_ = (int)((ulong)lVar20 >> 0x20);
        lVar20 = (long)top_blob->data + 0xc;
        sVar6 = top_blob->elemsize;
        uVar35 = 0;
        auVar45 = auVar45 ^ _DAT_001770f0;
        do {
          if (0 < (int)uVar41) {
            uVar2 = *(undefined4 *)((long)pvVar40 + uVar35 * 4);
            uVar37 = 0;
            do {
              auVar47._8_4_ = (int)uVar37;
              auVar47._0_8_ = uVar37;
              auVar47._12_4_ = (int)(uVar37 >> 0x20);
              auVar48 = (auVar47 | auVar13) ^ auVar11;
              iVar19 = auVar45._4_4_;
              if ((bool)(~(iVar19 < auVar48._4_4_ ||
                          auVar45._0_4_ < auVar48._0_4_ && auVar48._4_4_ == iVar19) & 1)) {
                *(undefined4 *)(lVar20 + -0xc + uVar37 * 4) = uVar2;
              }
              if (auVar48._12_4_ <= auVar45._12_4_ &&
                  (auVar48._8_4_ <= auVar45._8_4_ || auVar48._12_4_ != auVar45._12_4_)) {
                *(undefined4 *)(lVar20 + -8 + uVar37 * 4) = uVar2;
              }
              auVar47 = (auVar47 | auVar12) ^ auVar11;
              iVar34 = auVar47._4_4_;
              if (iVar34 <= iVar19 && (iVar34 != iVar19 || auVar47._0_4_ <= auVar45._0_4_)) {
                *(undefined4 *)(lVar20 + -4 + uVar37 * 4) = uVar2;
                *(undefined4 *)(lVar20 + uVar37 * 4) = uVar2;
              }
              uVar37 = uVar37 + 4;
            } while ((uVar41 + 3 & 0xfffffffc) != uVar37);
          }
          uVar35 = uVar35 + 1;
          lVar20 = lVar20 + sVar42 * sVar6;
        } while (uVar35 != ((ulong)local_e8 & 0xffffffff));
      }
    }
    else {
      uVar4 = this->resize_type;
      local_c8 = uVar35;
      local_98 = top_blob;
      if (uVar4 == 3) {
        iVar19 = uVar25 * 5 + uVar41 * 5;
        uVar35 = 0xffffffffffffffff;
        if (-1 < iVar19) {
          uVar35 = (long)iVar19 * 4;
        }
        piVar16 = (int *)operator_new__(uVar35);
        pMVar28 = local_98;
        local_e0 = (float *)(long)(int)uVar41;
        piVar43 = piVar16 + (long)local_e0;
        local_100 = (int *)(long)(int)uVar25;
        pfVar21 = (float *)(piVar43 + (long)local_100);
        cubic_coeffs((int)local_f8,uVar41,piVar16,pfVar21);
        local_c0 = piVar43;
        local_40 = pfVar21 + (int)(uVar41 * 4);
        cubic_coeffs(w,(int)local_c8,piVar43,pfVar21 + (int)(uVar41 * 4));
        if (0 < (int)local_e8) {
          local_38 = (ulong)local_e8 & 0xffffffff;
          local_88 = piVar16 + (long)local_e0 + (long)local_100;
          uVar35 = 0;
          local_100 = piVar16;
          do {
            local_a8 = (float *)CONCAT44(local_a8._4_4_,local_90->w);
            local_b0 = (float *)local_90->elemsize;
            local_f0 = (float *)(local_90->cstep * uVar35 * (long)local_b0 + (long)local_90->data);
            local_d8 = (int *)(long)pMVar28->w;
            local_d0 = (float *)(ulong)(uint)pMVar28->h;
            pvVar40 = pMVar28->data;
            local_a0 = pMVar28->elemsize;
            pfVar21 = (float *)pMVar28->cstep;
            if (local_d8 == (int *)0x0) {
              local_50 = (float *)0x0;
              local_70 = (float *)0x0;
            }
            else {
              local_108 = (float *)0x0;
              iVar19 = posix_memalign(&local_108,0x10,(long)local_d8 * 4 + 4);
              if (iVar19 != 0) {
                local_108 = (float *)0x0;
              }
              local_50 = local_108 + (long)local_d8;
              local_70 = local_108;
              local_108[(long)local_d8] = 1.4013e-45;
              piVar16 = local_100;
            }
            piVar43 = local_c0;
            local_48 = uVar35;
            if ((int)local_d8 == 0) {
              local_58 = (float *)0x0;
              local_78 = (float *)0x0;
              local_60 = (float *)0x0;
              local_b8 = (float *)0x0;
              local_68 = (float *)0x0;
              local_80 = (float *)0x0;
            }
            else {
              __size = (long)local_d8 * 4 + 4;
              local_108 = (float *)0x0;
              local_f8 = pfVar21;
              iVar19 = posix_memalign(&local_108,0x10,__size);
              piVar16 = local_d8;
              if (iVar19 != 0) {
                local_108 = (float *)0x0;
              }
              local_58 = local_108 + (long)local_d8;
              local_78 = local_108;
              local_108[(long)local_d8] = 1.4013e-45;
              if ((int)local_d8 == 0) {
                local_60 = (float *)0x0;
                local_b8 = (float *)0x0;
                local_68 = (float *)0x0;
                local_80 = (float *)0x0;
                pMVar28 = local_98;
                piVar16 = local_100;
                pfVar21 = local_f8;
              }
              else {
                local_108 = (float *)0x0;
                iVar19 = posix_memalign(&local_108,0x10,__size);
                if (iVar19 != 0) {
                  local_108 = (float *)0x0;
                }
                local_b8 = local_108;
                local_108[(long)piVar16] = 1.4013e-45;
                local_108 = (float *)0x0;
                iVar19 = posix_memalign(&local_108,0x10,__size);
                if (iVar19 != 0) {
                  local_108 = (float *)0x0;
                }
                local_60 = local_b8 + (long)piVar16;
                local_68 = local_108 + (long)piVar16;
                local_80 = local_108;
                local_108[(long)piVar16] = 1.4013e-45;
                pMVar28 = local_98;
                piVar16 = local_100;
                pfVar21 = local_f8;
              }
            }
            if (0 < (int)local_d0) {
              local_f0 = local_f0 + -1;
              lVar20 = ((ulong)local_d8 & 0xffffffff) * 4;
              pvVar40 = (void *)((long)pvVar40 + (long)pfVar21 * local_a0 * local_48);
              local_a0 = local_a0 * (long)local_d8;
              pfVar30 = (float *)0x0;
              local_f8 = local_40;
              uVar35 = 0xfffffffd;
              pfVar21 = local_70;
              pfVar24 = local_80;
              pfVar33 = local_b8;
              pfVar38 = local_78;
              do {
                uVar41 = piVar43[(long)pfVar30];
                local_c8 = (ulong)uVar41;
                uVar25 = (uint)uVar35;
                iVar19 = (int)local_d8;
                pfVar15 = pfVar33;
                pfVar32 = pfVar24;
                pfVar36 = pfVar21;
                pfVar39 = pfVar38;
                if (uVar41 != uVar25) {
                  if (uVar41 == uVar25 + 1) {
                    pfVar15 = pfVar24;
                    pfVar32 = pfVar21;
                    pfVar36 = pfVar38;
                    pfVar39 = pfVar33;
                    if (0 < iVar19) {
                      lVar18 = 0;
                      do {
                        pfVar24 = (float *)(local_88 + lVar18);
                        pfVar33 = (float *)((long)local_f0 +
                                           (long)*(int *)((long)piVar16 + lVar18) * 4 +
                                           (long)(int)((uVar41 + 2) * (int)local_a8) *
                                           (long)local_b0);
                        *(float *)((long)pfVar21 + lVar18) =
                             pfVar33[3] * pfVar24[3] + pfVar33[1] * pfVar24[1] +
                             pfVar33[2] * pfVar24[2] + *pfVar33 * *pfVar24;
                        lVar18 = lVar18 + 4;
                      } while (lVar20 - lVar18 != 0);
                    }
                  }
                  else if (uVar41 == uVar25 + 2) {
                    pfVar15 = pfVar21;
                    pfVar32 = pfVar38;
                    pfVar36 = pfVar33;
                    pfVar39 = pfVar24;
                    if (0 < iVar19) {
                      lVar18 = 0;
                      do {
                        iVar34 = *(int *)((long)piVar16 + lVar18);
                        pfVar24 = (float *)(local_88 + lVar18);
                        fVar44 = *pfVar24;
                        fVar46 = pfVar24[1];
                        fVar9 = pfVar24[2];
                        fVar10 = pfVar24[3];
                        pfVar24 = (float *)((long)local_f0 +
                                           (long)iVar34 * 4 +
                                           (long)(int)((uVar41 + 1) * (int)local_a8) *
                                           (long)local_b0);
                        *(float *)((long)pfVar21 + lVar18) =
                             pfVar24[3] * fVar10 + pfVar24[1] * fVar46 +
                             pfVar24[2] * fVar9 + *pfVar24 * fVar44;
                        pfVar24 = (float *)((long)local_f0 +
                                           (long)iVar34 * 4 +
                                           (long)(int)((uVar41 + 2) * (int)local_a8) *
                                           (long)local_b0);
                        *(float *)((long)pfVar38 + lVar18) =
                             pfVar24[3] * fVar10 + pfVar24[1] * fVar46 +
                             pfVar24[2] * fVar9 + *pfVar24 * fVar44;
                        lVar18 = lVar18 + 4;
                        piVar43 = local_c0;
                      } while (lVar20 - lVar18 != 0);
                    }
                  }
                  else if (uVar41 == uVar25 + 3) {
                    pfVar15 = pfVar38;
                    pfVar32 = pfVar33;
                    pfVar36 = pfVar24;
                    pfVar39 = pfVar21;
                    piVar43 = local_c0;
                    if (0 < iVar19) {
                      lVar18 = 0;
                      do {
                        lVar27 = (long)*(int *)((long)local_100 + lVar18);
                        pfVar24 = (float *)(local_88 + lVar18);
                        fVar44 = *pfVar24;
                        fVar46 = pfVar24[1];
                        fVar9 = pfVar24[2];
                        fVar10 = pfVar24[3];
                        pfVar24 = (float *)((long)local_f0 +
                                           lVar27 * 4 +
                                           (long)(int)(uVar41 * (int)local_a8) * (long)local_b0);
                        *(float *)((long)pfVar21 + lVar18) =
                             pfVar24[3] * fVar10 + pfVar24[1] * fVar46 +
                             pfVar24[2] * fVar9 + *pfVar24 * fVar44;
                        pfVar24 = (float *)((long)local_f0 +
                                           lVar27 * 4 +
                                           (long)(int)((uVar41 + 1) * (int)local_a8) *
                                           (long)local_b0);
                        *(float *)((long)pfVar38 + lVar18) =
                             pfVar24[3] * fVar10 + pfVar24[1] * fVar46 +
                             pfVar24[2] * fVar9 + *pfVar24 * fVar44;
                        pfVar24 = (float *)((long)local_f0 +
                                           lVar27 * 4 +
                                           (long)(int)((uVar41 + 2) * (int)local_a8) *
                                           (long)local_b0);
                        *(float *)((long)pfVar33 + lVar18) =
                             pfVar24[3] * fVar10 + pfVar24[1] * fVar46 +
                             pfVar24[2] * fVar9 + *pfVar24 * fVar44;
                        lVar18 = lVar18 + 4;
                        pMVar28 = local_98;
                      } while (lVar20 - lVar18 != 0);
                    }
                  }
                  else {
                    piVar43 = local_c0;
                    if (0 < iVar19) {
                      local_e0 = (float *)((long)(int)(uVar41 * (int)local_a8) * (long)local_b0 +
                                          (long)local_f0);
                      local_e8 = (float *)((long)(int)((uVar41 + 1) * (int)local_a8) *
                                           (long)local_b0 + (long)local_f0);
                      lVar18 = 0;
                      do {
                        lVar27 = (long)*(int *)((long)local_100 + lVar18);
                        pfVar1 = (float *)(local_88 + lVar18);
                        fVar44 = *pfVar1;
                        fVar46 = pfVar1[1];
                        fVar9 = pfVar1[2];
                        fVar10 = pfVar1[3];
                        pfVar1 = (float *)((long)local_f0 +
                                          lVar27 * 4 +
                                          (long)(int)((uVar41 - 1) * (int)local_a8) * (long)local_b0
                                          );
                        *(float *)((long)pfVar21 + lVar18) =
                             pfVar1[3] * fVar10 + pfVar1[1] * fVar46 +
                             pfVar1[2] * fVar9 + *pfVar1 * fVar44;
                        pfVar1 = local_e0 + lVar27;
                        *(float *)((long)pfVar38 + lVar18) =
                             pfVar1[3] * fVar10 + pfVar1[1] * fVar46 +
                             pfVar1[2] * fVar9 + *pfVar1 * fVar44;
                        pfVar1 = local_e8 + lVar27;
                        *(float *)((long)pfVar33 + lVar18) =
                             pfVar1[3] * fVar10 + pfVar1[1] * fVar46 +
                             pfVar1[2] * fVar9 + *pfVar1 * fVar44;
                        pfVar1 = (float *)((long)local_f0 +
                                          lVar27 * 4 +
                                          (long)(int)((uVar41 + 2) * (int)local_a8) * (long)local_b0
                                          );
                        *(float *)((long)pfVar24 + lVar18) =
                             pfVar1[3] * fVar10 + pfVar1[1] * fVar46 +
                             pfVar1[2] * fVar9 + *pfVar1 * fVar44;
                        lVar18 = lVar18 + 4;
                        pMVar28 = local_98;
                      } while (lVar20 - lVar18 != 0);
                    }
                  }
                }
                if (0 < iVar19) {
                  fVar44 = *local_f8;
                  fVar46 = local_f8[1];
                  fVar9 = local_f8[2];
                  fVar10 = local_f8[3];
                  lVar18 = 0;
                  do {
                    *(float *)((long)pvVar40 + lVar18 * 4) =
                         pfVar32[lVar18] * fVar10 + pfVar39[lVar18] * fVar46 +
                         pfVar15[lVar18] * fVar9 + pfVar36[lVar18] * fVar44;
                    lVar18 = lVar18 + 1;
                  } while (iVar19 != (int)lVar18);
                }
                local_f8 = local_f8 + 4;
                pfVar30 = (float *)((long)pfVar30 + 1);
                pvVar40 = (void *)((long)pvVar40 + local_a0);
                uVar35 = local_c8;
                piVar16 = local_100;
                pfVar21 = pfVar36;
                pfVar24 = pfVar32;
                pfVar33 = pfVar15;
                pfVar38 = pfVar39;
              } while (pfVar30 != local_d0);
            }
            if (local_68 != (float *)0x0) {
              LOCK();
              fVar44 = *local_68;
              *local_68 = (float)((int)*local_68 + -1);
              UNLOCK();
              if ((local_80 != (float *)0x0) && (fVar44 == 1.4013e-45)) {
                free(local_80);
                piVar16 = local_100;
              }
            }
            uVar35 = local_48;
            if (local_60 != (float *)0x0) {
              LOCK();
              fVar44 = *local_60;
              *local_60 = (float)((int)*local_60 + -1);
              UNLOCK();
              if ((local_b8 != (float *)0x0) && (fVar44 == 1.4013e-45)) {
                free(local_b8);
                piVar16 = local_100;
              }
            }
            if (local_58 != (float *)0x0) {
              LOCK();
              fVar44 = *local_58;
              *local_58 = (float)((int)*local_58 + -1);
              UNLOCK();
              if ((local_78 != (float *)0x0) && (fVar44 == 1.4013e-45)) {
                free(local_78);
                piVar16 = local_100;
              }
            }
            if (local_50 != (float *)0x0) {
              LOCK();
              *local_50 = (float)((int)*local_50 + -1);
              UNLOCK();
              if (local_70 != (float *)0x0 && *local_50 == 0.0) {
                free(local_70);
                piVar16 = local_100;
              }
            }
            uVar35 = uVar35 + 1;
          } while (uVar35 != local_38);
        }
      }
      else {
        if (uVar4 != 2) {
          if (uVar4 != 1) {
            fprintf(_stderr,"unsupported resize type %d %d %d\n",(ulong)uVar4,uVar35,uVar37);
            return -0xe9;
          }
          if ((int)local_e8 < 1) {
            return 0;
          }
          sVar42 = local_90->cstep;
          sVar6 = local_90->elemsize;
          pvVar40 = local_90->data;
          local_e0 = (float *)top_blob->data;
          sVar7 = top_blob->cstep;
          iVar19 = (int)local_f8 + -1;
          sVar8 = top_blob->elemsize;
          uVar26 = 0;
          do {
            if (0 < (int)uVar25) {
              uVar14 = 0;
              pfVar21 = local_e0;
              do {
                if (0 < (int)uVar41) {
                  iVar34 = (int)((float)(int)uVar14 / this->height_scale);
                  if ((int)(w - 1) < iVar34) {
                    iVar34 = w - 1;
                  }
                  uVar29 = 0;
                  do {
                    iVar23 = (int)((float)(int)uVar29 / this->width_scale);
                    iVar31 = iVar19;
                    if (iVar23 <= iVar19) {
                      iVar31 = iVar23;
                    }
                    *(undefined4 *)((long)pfVar21 + uVar29 * 4) =
                         *(undefined4 *)
                          ((long)pvVar40 +
                          (long)(iVar31 + iVar34 * (int)local_f8) * 4 + sVar42 * sVar6 * uVar26);
                    uVar29 = uVar29 + 1;
                  } while (uVar37 != uVar29);
                }
                uVar14 = uVar14 + 1;
                pfVar21 = (float *)((long)pfVar21 + uVar37 * 4);
              } while (uVar14 != uVar35);
            }
            uVar26 = uVar26 + 1;
            local_e0 = (float *)((long)local_e0 + sVar7 * sVar8);
          } while (uVar26 != ((ulong)local_e8 & 0xffffffff));
          return 0;
        }
        iVar19 = uVar25 * 3 + uVar41 * 3;
        uVar35 = 0xffffffffffffffff;
        if (-1 < iVar19) {
          uVar35 = (long)iVar19 * 4;
        }
        piVar16 = (int *)operator_new__(uVar35);
        local_e0 = (float *)(long)(int)uVar41;
        piVar43 = piVar16 + (long)local_e0;
        lVar20 = (long)(int)uVar25;
        pfVar21 = (float *)(piVar43 + lVar20);
        linear_coeffs((int)local_f8,uVar41,piVar16,pfVar21);
        local_b8 = pfVar21 + (int)(uVar41 * 2);
        linear_coeffs(w,(int)local_c8,piVar43,pfVar21 + (int)(uVar41 * 2));
        pfVar21 = local_e0;
        if (0 < (int)local_e8) {
          local_c0 = (int *)((ulong)local_e8 & 0xffffffff);
          piVar22 = (int *)0x0;
          do {
            local_c8 = CONCAT44(local_c8._4_4_,local_90->w);
            local_e8 = (float *)local_90->elemsize;
            local_e0 = (float *)(local_90->cstep * (long)piVar22 * (long)local_e8 +
                                (long)local_90->data);
            uVar41 = local_98->w;
            sVar42 = (size_t)(int)uVar41;
            local_100 = (int *)(ulong)(uint)local_98->h;
            pvVar40 = local_98->data;
            pfVar24 = (float *)local_98->elemsize;
            piVar17 = (int *)local_98->cstep;
            local_d8 = piVar22;
            if (sVar42 == 0) {
              local_a8 = (float *)0x0;
              local_d0 = (float *)0x0;
              local_b0 = (float *)0x0;
              local_f0 = (float *)0x0;
            }
            else {
              local_f0 = (float *)(sVar42 * 4 + 4);
              local_108 = (float *)0x0;
              local_f8 = pfVar24;
              local_88 = piVar17;
              iVar19 = posix_memalign(&local_108,0x10,(size_t)local_f0);
              if (iVar19 != 0) {
                local_108 = (float *)0x0;
              }
              local_d0 = local_108;
              local_108[sVar42] = 1.4013e-45;
              local_108 = (float *)0x0;
              iVar19 = posix_memalign(&local_108,0x10,(size_t)local_f0);
              if (iVar19 != 0) {
                local_108 = (float *)0x0;
              }
              local_a8 = local_d0 + sVar42;
              local_b0 = local_108 + sVar42;
              local_f0 = local_108;
              local_108[sVar42] = 1.4013e-45;
              piVar17 = local_88;
              pfVar24 = local_f8;
            }
            if (0 < (int)local_100) {
              local_f8 = (float *)((long)pfVar24 * sVar42);
              pvVar40 = (void *)((long)pvVar40 + (long)piVar17 * (long)pfVar24 * (long)local_d8);
              piVar22 = (int *)0x0;
              pfVar24 = local_b8;
              pfVar33 = local_d0;
              pfVar38 = local_f0;
              iVar19 = -2;
              do {
                iVar34 = piVar43[(long)piVar22];
                pfVar30 = pfVar33;
                if (iVar34 != iVar19) {
                  if (iVar34 == iVar19 + 1) {
                    pfVar30 = pfVar38;
                    pfVar38 = pfVar33;
                    if (0 < (int)uVar41) {
                      uVar35 = 0;
                      do {
                        uVar3 = *(undefined8 *)
                                 ((long)local_e0 +
                                 (long)piVar16[uVar35] * 4 +
                                 (long)((iVar34 + 1) * (int)local_c8) * (long)local_e8);
                        pfVar33[uVar35] =
                             (float)((ulong)uVar3 >> 0x20) *
                             (float)((ulong)*(undefined8 *)
                                             (piVar16 + (long)pfVar21 + lVar20 + uVar35 * 2) >> 0x20
                                    ) +
                             (float)uVar3 *
                             (float)*(undefined8 *)(piVar16 + (long)pfVar21 + lVar20 + uVar35 * 2);
                        uVar35 = uVar35 + 1;
                      } while (uVar41 != uVar35);
                    }
                  }
                  else if (0 < (int)uVar41) {
                    uVar35 = 0;
                    do {
                      iVar19 = piVar16[uVar35];
                      uVar3 = *(undefined8 *)
                               ((long)local_e0 +
                               (long)iVar19 * 4 + (long)(iVar34 * (int)local_c8) * (long)local_e8);
                      fVar44 = (float)*(undefined8 *)(piVar16 + (long)pfVar21 + lVar20 + uVar35 * 2)
                      ;
                      fVar46 = (float)((ulong)*(undefined8 *)
                                               (piVar16 + (long)pfVar21 + lVar20 + uVar35 * 2) >>
                                      0x20);
                      pfVar33[uVar35] =
                           (float)((ulong)uVar3 >> 0x20) * fVar46 + (float)uVar3 * fVar44;
                      uVar3 = *(undefined8 *)
                               ((long)local_e0 +
                               (long)iVar19 * 4 +
                               (long)((iVar34 + 1) * (int)local_c8) * (long)local_e8);
                      pfVar38[uVar35] =
                           (float)((ulong)uVar3 >> 0x20) * fVar46 + (float)uVar3 * fVar44;
                      uVar35 = uVar35 + 1;
                    } while (uVar41 != uVar35);
                  }
                }
                if (0 < (int)uVar41) {
                  fVar44 = *pfVar24;
                  fVar46 = pfVar24[1];
                  lVar18 = 0;
                  do {
                    *(float *)((long)pvVar40 + lVar18 * 4) =
                         pfVar38[lVar18] * fVar46 + pfVar30[lVar18] * fVar44;
                    lVar18 = lVar18 + 1;
                  } while (uVar41 != (uint)lVar18);
                }
                pfVar24 = pfVar24 + 2;
                piVar22 = (int *)((long)piVar22 + 1);
                pvVar40 = (void *)((long)pvVar40 + (long)local_f8);
                pfVar33 = pfVar30;
                iVar19 = iVar34;
                local_a0 = sVar42;
              } while (piVar22 != local_100);
            }
            if (local_b0 != (float *)0x0) {
              LOCK();
              fVar44 = *local_b0;
              *local_b0 = (float)((int)*local_b0 + -1);
              UNLOCK();
              if ((local_f0 != (float *)0x0) && (fVar44 == 1.4013e-45)) {
                free(local_f0);
              }
            }
            if (local_a8 != (float *)0x0) {
              LOCK();
              fVar44 = *local_a8;
              *local_a8 = (float)((int)*local_a8 + -1);
              UNLOCK();
              if ((local_d0 != (float *)0x0) && (fVar44 == 1.4013e-45)) {
                free(local_d0);
              }
            }
            piVar22 = (int *)((long)local_d8 + 1);
          } while (piVar22 != local_c0);
        }
      }
      operator_delete__(piVar16);
    }
    return 0;
  }
  return -100;
}

Assistant:

int Interp::forward(const Mat &bottom_blob, Mat &top_blob, const Option& opt) const
{
    int h = bottom_blob.h;
    int w = bottom_blob.w;
    int c = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

    int oh = output_height;
    int ow = output_width;
    if (bottom_blob.dims == 1)
    {
        h = 1;
        w = 1;
        c = bottom_blob.w;
    }
    if (oh == 0 || ow == 0)
    {
        oh = h * height_scale;
        ow = w * width_scale;
    }
    if (oh == h && ow == w)
    {
        top_blob = bottom_blob;
        return 0;
    }
    top_blob.create(ow, oh, c, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    if (bottom_blob.dims == 1)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < c; ++q)
        {
            Mat top_blob_c = top_blob.channel(q);
            const float *ptr = ((const float*)bottom_blob.data + q);
            top_blob_c.fill(*ptr);
        }
        return 0;
    }

    if (resize_type == 1)// nearest
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < c; ++q)
        {
            const float *ptr = bottom_blob.channel(q);
            float *output_ptr = top_blob.channel(q);
            for (int y = 0; y < oh; ++y)
            {
                const int in_y = std::min((int) (y / height_scale), (h - 1));
                for (int x = 0; x < ow; ++x)
                {
                    const int in_x = std::min((int) (x / width_scale), (w - 1));
                    output_ptr[ow * y + x] = ptr[in_y * w + in_x];
                }
            }
        }
        return 0;

    }
    else if (resize_type == 2)// bilinear
    {
        int* buf = new int[ow + oh + ow*2 + oh*2];

        int* xofs = buf;//new int[ow];
        int* yofs = buf + ow;//new int[oh];

        float* alpha = (float*)(buf + ow + oh);//new float[ow * 2];
        float* beta = (float*)(buf + ow + oh + ow*2);//new float[oh * 2];

        linear_coeffs(w, ow, xofs, alpha);
        linear_coeffs(h, oh, yofs, beta);

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < c; ++q)
        {
            const Mat src = bottom_blob.channel(q);
            Mat dst = top_blob.channel(q);

            resize_bilinear_image(src, dst, alpha, xofs, beta, yofs);
        }

        delete[] buf;

        return 0;
    }
    else if (resize_type == 3)// bicubic
    {
        int* buf = new int[ow + oh + ow*4 + oh*4];

        int* xofs = buf;//new int[ow];
        int* yofs = buf + ow;//new int[oh];

        float* alpha = (float*)(buf + ow + oh);//new float[ow * 4];
        float* beta = (float*)(buf + ow + oh + ow*4);//new float[oh * 4];

        cubic_coeffs(w, ow, xofs, alpha);
        cubic_coeffs(h, oh, yofs, beta);

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < c; ++q)
        {
            const Mat src = bottom_blob.channel(q);
            Mat dst = top_blob.channel(q);

            resize_bicubic_image(src, dst, alpha, xofs, beta, yofs);
        }

        delete[] buf;

        return 0;
    }
    else
    {
        fprintf(stderr, "unsupported resize type %d %d %d\n", resize_type, oh, ow);
        return -233;
    }
}